

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_firedemon.cpp
# Opt level: O3

int AF_A_FiredSplotch(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  uint uVar4;
  PClass *pPVar5;
  PClassActor *pPVar6;
  AActor *pAVar7;
  undefined8 *puVar8;
  char *__assertion;
  bool bVar9;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005de3f5;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    puVar8 = (undefined8 *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (puVar8 == (undefined8 *)0x0) {
LAB_005de16b:
        puVar8 = (undefined8 *)0x0;
      }
      else {
        pPVar5 = (PClass *)puVar8[1];
        if (pPVar5 == (PClass *)0x0) {
          pPVar5 = (PClass *)(**(code **)*puVar8)(puVar8);
          puVar8[1] = pPVar5;
        }
        bVar9 = pPVar5 != (PClass *)0x0;
        if (pPVar5 != pPVar3 && bVar9) {
          do {
            pPVar5 = pPVar5->ParentClass;
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 == pPVar3) break;
          } while (pPVar5 != (PClass *)0x0);
        }
        if (!bVar9) {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005de3f5;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005de22b;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005de3e5;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar5 = (PClass *)puVar2[1];
            if (pPVar5 == (PClass *)0x0) {
              pPVar5 = (PClass *)(**(code **)*puVar2)(puVar2);
              puVar2[1] = pPVar5;
            }
            bVar9 = pPVar5 != (PClass *)0x0;
            if (pPVar5 != pPVar3 && bVar9) {
              do {
                pPVar5 = pPVar5->ParentClass;
                bVar9 = pPVar5 != (PClass *)0x0;
                if (pPVar5 == pPVar3) break;
              } while (pPVar5 != (PClass *)0x0);
            }
            if (!bVar9) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005de3f5;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005de3e5;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005de22b:
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"FireDemonSplotch1",false);
        local_48.X = (double)puVar8[9];
        local_48.Y = (double)puVar8[10];
        local_48.Z = (double)puVar8[0xb];
        pPVar6 = ClassForSpawn(&local_4c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).X = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).Y = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).Z = (double)(uVar4 & 0xff) * 0.015625 + 3.0;
        }
        local_4c.Index = FName::NameManager::FindName(&FName::NameData,"FireDemonSplotch2",false);
        local_48.X = (double)puVar8[9];
        local_48.Y = (double)puVar8[10];
        local_48.Z = (double)puVar8[0xb];
        pPVar6 = ClassForSpawn(&local_4c);
        pAVar7 = AActor::StaticSpawn(pPVar6,&local_48,ALLOW_REPLACE,false);
        if (pAVar7 != (AActor *)0x0) {
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).X = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).Y = (double)(int)((uVar4 & 0xff) - 0x80) * 0.03125;
          uVar4 = FRandom::GenRand32(&pr_firedemonsplotch);
          (pAVar7->Vel).Z = (double)(uVar4 & 0xff) * 0.015625 + 3.0;
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005de3f5;
    }
    if (puVar8 == (undefined8 *)0x0) goto LAB_005de16b;
  }
LAB_005de3e5:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005de3f5:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_firedemon.cpp"
                ,0xe5,"int AF_A_FiredSplotch(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FiredSplotch)
{
	PARAM_ACTION_PROLOGUE;

	AActor *mo;

	mo = Spawn ("FireDemonSplotch1", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	mo = Spawn ("FireDemonSplotch2", self->Pos(), ALLOW_REPLACE);
	if (mo)
	{
		mo->Vel.X = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Y = (pr_firedemonsplotch() - 128) / 32.;
		mo->Vel.Z = (pr_firedemonsplotch() / 64.) + 3;
	}
	return 0;
}